

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O3

void GeneratedSaxParser::Utils::fillErrorMsg(ParserChar *dest,ParserChar *src,size_t maxLen)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = 0xffffffffffffffff;
  do {
    lVar1 = uVar2 + 1;
    uVar2 = uVar2 + 1;
  } while (src[lVar1] != '\0');
  if (uVar2 < maxLen) {
    maxLen = uVar2;
  }
  memcpy(dest,src,maxLen);
  dest[maxLen] = '\0';
  return;
}

Assistant:

void Utils::fillErrorMsg(ParserChar* dest, const ParserChar* src, size_t maxLen)
    {
        size_t bufferLength = 0;
        while (src[bufferLength])
            ++bufferLength;
        size_t length = std::min(maxLen, bufferLength);
        memcpy(dest, src, length);
        dest[length] = '\0';
    }